

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O0

bool verify_tst<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
               (TSTNode<unsigned_char> *node,size_t depth)

{
  size_t depth_local;
  TSTNode<unsigned_char> *node_local;
  
  verify_bucket<0u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (node,depth);
  verify_bucket<1u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (node,depth);
  verify_bucket<2u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_char>
            (node,depth);
  return true;
}

Assistant:

static bool
verify_tst(TSTNode<CharT>* node, size_t depth)
{
	if (node->pivot)
		debug() << __func__ << "() pivot=" << node->pivot << " depth=" << depth << '\n';
	else
		debug() << __func__ << "() pivot=" << int(node->pivot) << " depth=" << depth << '\n';
	debug_indent;
	verify_bucket<0, BucketT, CharT>(node, depth);
	verify_bucket<1, BucketT, CharT>(node, depth);
	verify_bucket<2, BucketT, CharT>(node, depth);
	return true;
}